

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O3

int read_Header(archive_read *a,_7z_header_info *h,int check_header_id)

{
  _7z_coders_info *val;
  uchar uVar1;
  _7z_stream_info *si;
  size_t __nmemb;
  _7z_folder *p_Var2;
  ulong uVar3;
  byte bVar4;
  int iVar5;
  uchar *p;
  uchar *puVar6;
  byte *pbVar7;
  _7z_folder *p_Var8;
  _7z_coder *p_Var9;
  uint64_t *puVar10;
  uint64_t uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  int iVar15;
  uint uVar16;
  _7z_coder *p_Var18;
  uint64_t uVar19;
  uint uVar20;
  size_t b;
  size_t rbytes;
  bool bVar21;
  uint64_t size;
  ulong local_38;
  ulong uVar17;
  
  si = (_7z_stream_info *)a->format->data;
  if (check_header_id != 0) {
    puVar6 = header_bytes(a,1);
    if (puVar6 == (uchar *)0x0) {
      return -1;
    }
    if (*puVar6 != '\x01') {
      return -1;
    }
  }
  pbVar7 = header_bytes(a,1);
  if (pbVar7 == (byte *)0x0) {
    return -1;
  }
  bVar4 = *pbVar7;
  if (bVar4 == 2) {
    puVar6 = header_bytes(a,1);
    if (puVar6 == (uchar *)0x0) {
      return -1;
    }
    while (*puVar6 != '\0') {
      iVar5 = parse_7zip_uint64(a,&local_38);
      if (iVar5 < 0) {
        return -1;
      }
      puVar6 = header_bytes(a,1);
      if (puVar6 == (uchar *)0x0) {
        return -1;
      }
    }
    pbVar7 = header_bytes(a,1);
    if (pbVar7 == (byte *)0x0) {
      return -1;
    }
    bVar4 = *pbVar7;
  }
  if (bVar4 == 4) {
    iVar5 = read_StreamsInfo(a,si);
    if (iVar5 < 0) {
      return -1;
    }
    pbVar7 = header_bytes(a,1);
    if (pbVar7 == (byte *)0x0) {
      return -1;
    }
    bVar4 = *pbVar7;
  }
  if (bVar4 == 0) {
    return (uint)bVar4;
  }
  if (bVar4 == 5) {
    val = &si[1].ci;
    iVar5 = parse_7zip_uint64(a,&val->numFolders);
    if ((-1 < iVar5) && (val->numFolders < 0x5f5e101)) {
      p_Var8 = (_7z_folder *)calloc(val->numFolders,0x50);
      si[1].ci.folders = p_Var8;
      if ((p_Var8 != (_7z_folder *)0x0) && (pbVar7 = header_bytes(a,1), pbVar7 != (byte *)0x0)) {
        uVar16 = 0;
        do {
          bVar4 = *pbVar7;
          if (bVar4 == 0) {
            if (si[1].ci.numFolders == 0) {
              return 0;
            }
            p_Var2 = (si->ci).folders;
            uVar14 = 0;
            iVar5 = 0;
            iVar15 = 0;
            uVar16 = 0;
            uVar12 = 0;
            goto LAB_00176dd7;
          }
          iVar5 = parse_7zip_uint64(a,&local_38);
          uVar12 = local_38;
          if (iVar5 < 0) {
            return -1;
          }
          if (si[1].pi.numPackStreams < local_38) {
            return -1;
          }
          switch(bVar4) {
          case 0xe:
            if (h->emptyStreamBools != (uchar *)0x0) {
              return -1;
            }
            __nmemb = val->numFolders;
            puVar6 = (uchar *)calloc(__nmemb,1);
            h->emptyStreamBools = puVar6;
            if (puVar6 == (uchar *)0x0) {
              return -1;
            }
            iVar5 = read_Bools(a,puVar6,__nmemb);
            if (iVar5 < 0) {
              return -1;
            }
            if (val->numFolders == 0) {
              uVar16 = 0;
            }
            else {
              uVar12 = 0;
              uVar16 = 0;
              do {
                uVar16 = (uVar16 + 1) - (uint)(h->emptyStreamBools[uVar12] == '\0');
                uVar12 = uVar12 + 1;
              } while ((uVar12 & 0xffffffff) < val->numFolders);
            }
            break;
          case 0xf:
            if ((int)uVar16 < 1) goto switchD_00176a38_caseD_16;
            if (h->emptyFileBools != (uchar *)0x0) {
              return -1;
            }
            puVar6 = (uchar *)calloc((ulong)uVar16,1);
            h->emptyFileBools = puVar6;
LAB_00176b4a:
            if (puVar6 == (uchar *)0x0) {
              return -1;
            }
            iVar5 = read_Bools(a,puVar6,(ulong)uVar16);
            goto LAB_00176b61;
          case 0x10:
            if (0 < (int)uVar16) {
              if (h->antiBools != (uchar *)0x0) {
                return -1;
              }
              puVar6 = (uchar *)calloc((ulong)uVar16,1);
              h->antiBools = puVar6;
              goto LAB_00176b4a;
            }
          default:
switchD_00176a38_caseD_16:
            puVar6 = header_bytes(a,local_38);
            if (puVar6 == (uchar *)0x0) {
              return -1;
            }
            break;
          case 0x11:
            puVar6 = header_bytes(a,1);
            if (puVar6 == (uchar *)0x0) {
              return -1;
            }
            uVar12 = uVar12 - 1;
            if ((uVar12 & 1) != 0) {
              return -1;
            }
            uVar19 = val->numFolders;
            if (uVar12 < uVar19 * 4) {
              return -1;
            }
            if (si[1].ss.unpack_streams != 0) {
              return -1;
            }
            p_Var9 = (_7z_coder *)malloc(uVar12);
            si[1].ss.unpack_streams = (size_t)p_Var9;
            if (p_Var9 == (_7z_coder *)0x0) {
              return -1;
            }
            uVar14 = uVar12;
            if (uVar12 != 0) {
              do {
                rbytes = 0x10000;
                if (uVar14 < 0x10000) {
                  rbytes = uVar14;
                }
                puVar6 = header_bytes(a,rbytes);
                if (puVar6 == (uchar *)0x0) {
                  return -1;
                }
                memcpy(p_Var9,puVar6,rbytes);
                p_Var9 = (_7z_coder *)((long)&p_Var9->codec + rbytes);
                uVar14 = uVar14 - rbytes;
              } while (uVar14 != 0);
              uVar19 = si[1].ci.numFolders;
              p_Var9 = (_7z_coder *)si[1].ss.unpack_streams;
            }
            if (uVar19 != 0) {
              uVar14 = 0;
              do {
                (&p_Var8->coders)[uVar14 * 10] = p_Var9;
                if (uVar12 < 2) {
                  return -1;
                }
                uVar11 = 0;
                p_Var18 = p_Var9;
                while ((p_Var9 = (_7z_coder *)((long)&p_Var18->codec + 2),
                       (char)p_Var18->codec != '\0' ||
                       (*(undefined1 *)((long)&p_Var18->codec + 1) != '\0'))) {
                  uVar12 = uVar12 - 2;
                  uVar11 = uVar11 + 2;
                  p_Var18 = p_Var9;
                  if (uVar12 < 2) {
                    return -1;
                  }
                }
                (&p_Var8->numCoders)[uVar14 * 10] = uVar11;
                uVar12 = uVar12 - 2;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (uVar14 < uVar19);
            }
            break;
          case 0x12:
          case 0x13:
          case 0x14:
            iVar5 = read_Times(a,h,(uint)bVar4);
LAB_00176b61:
            if (iVar5 < 0) {
              return -1;
            }
            break;
          case 0x15:
            puVar6 = header_bytes(a,2);
            if (puVar6 == (uchar *)0x0) {
              return -1;
            }
            if (h->attrBools != (uchar *)0x0) {
              return -1;
            }
            uVar1 = *puVar6;
            uVar19 = val->numFolders;
            puVar6 = (uchar *)calloc(uVar19,1);
            h->attrBools = puVar6;
            if (puVar6 == (uchar *)0x0) {
              return -1;
            }
            if (uVar1 == '\0') {
              iVar5 = read_Bools(a,puVar6,uVar19);
              if (iVar5 < 0) {
                return -1;
              }
              uVar19 = val->numFolders;
            }
            else {
              memset(puVar6,1,uVar19);
            }
            if (uVar19 != 0) {
              uVar12 = 0;
              uVar14 = 1;
              do {
                if (h->attrBools[uVar12] != '\0') {
                  puVar6 = header_bytes(a,4);
                  if (puVar6 == (uchar *)0x0) {
                    return -1;
                  }
                  *(undefined4 *)(&p_Var8->digest_defined + uVar12 * 0x50) = *(undefined4 *)puVar6;
                  uVar19 = val->numFolders;
                }
                bVar21 = uVar14 < uVar19;
                uVar12 = uVar14;
                uVar14 = (ulong)((int)uVar14 + 1);
              } while (bVar21);
            }
            break;
          case 0x19:
            if (local_38 != 0) goto switchD_00176a38_caseD_16;
          }
          pbVar7 = header_bytes(a,1);
        } while (pbVar7 != (byte *)0x0);
      }
    }
  }
  return -1;
LAB_00176dd7:
  if ((h->emptyStreamBools == (uchar *)0x0) || (h->emptyStreamBools[uVar14] == '\0')) {
    *(byte *)(&p_Var8->bindPairs + uVar14 * 10) = *(byte *)(&p_Var8->bindPairs + uVar14 * 10) | 0x10
    ;
  }
  uVar13 = *(uint *)(&p_Var8->digest_defined + uVar14 * 0x50);
  if ((short)uVar13 < 0) {
    uVar20 = uVar13 >> 0x10;
  }
  else {
    uVar20 = 0x416d;
    if ((uVar13 & 0x10) == 0) {
      uVar20 = 0x8124;
    }
    uVar20 = uVar20 | (uint)((uVar13 & 1) == 0) << 7;
  }
  puVar10 = &p_Var8->numCoders + uVar14 * 10;
  *(uint *)((long)puVar10 + 0x44) = uVar20;
  if ((*(uint *)(puVar10 + 3) & 0x10) == 0) {
    if (h->emptyFileBools == (uchar *)0x0) {
      if (uVar20 != 0) {
        bVar21 = false;
        goto LAB_00176eab;
      }
LAB_00176efa:
      *(undefined4 *)((long)puVar10 + 0x44) = 0x41ff;
LAB_00176f01:
      uVar3 = *puVar10;
      if ((1 < uVar3) &&
         ((p_Var9 = (_7z_coder *)puVar10[1], *(char *)((long)p_Var9 + (uVar3 - 2)) != '/' ||
          (*(char *)((long)p_Var9 + (uVar3 - 1)) != '\0')))) {
        *(undefined1 *)((long)&p_Var9->codec + uVar3) = 0x2f;
        *(undefined1 *)((long)&((_7z_coder *)puVar10[1])->codec + *puVar10 + 1) = 0;
        *puVar10 = *puVar10 + 2;
        uVar13 = *(uint *)(puVar10 + 9);
      }
    }
    else {
      uVar1 = h->emptyFileBools[iVar15];
      bVar21 = uVar1 != '\0';
      iVar15 = iVar15 + 1;
      if (uVar20 == 0) {
        if (uVar1 == '\0') goto LAB_00176efa;
        *(undefined4 *)((long)puVar10 + 0x44) = 0x81b6;
      }
      else {
LAB_00176eab:
        if ((!bVar21) && ((uVar20 & 0xf000) != 0x4000)) {
          uVar20 = uVar20 & 0xfff | 0x4000;
          *(uint *)((long)puVar10 + 0x44) = uVar20;
        }
        if ((uVar20 & 0xf000) == 0x4000) goto LAB_00176f01;
      }
    }
    *(undefined4 *)((long)puVar10 + 0x14) = 0xffffffff;
  }
  else {
    if ((si->ss).unpack_streams <= (ulong)(long)iVar5) {
      return -1;
    }
    if (uVar20 == 0) {
      *(undefined4 *)((long)puVar10 + 0x44) = 0x81b6;
    }
    if ((si->ss).digestsDefined[iVar5] != '\0') {
      *(uint *)(puVar10 + 3) = *(uint *)(puVar10 + 3) | 8;
    }
    *(int *)((long)puVar10 + 0x14) = iVar5;
    iVar5 = iVar5 + 1;
  }
  if ((uVar13 & 1) != 0) {
    *(byte *)((long)puVar10 + 0x44) = *(byte *)((long)puVar10 + 0x44) & 0x6d;
  }
  if (((ulong)puVar10[3] & 0x10) == 0 && uVar16 == 0) {
    *(undefined4 *)(puVar10 + 2) = 0xffffffff;
    uVar16 = 0;
  }
  else {
    if (uVar16 == 0) {
      while( true ) {
        if ((si->ci).numFolders <= uVar12) {
          return -1;
        }
        if (p_Var2[uVar12].numUnpackStreams != 0) break;
        uVar12 = (ulong)((int)uVar12 + 1);
      }
    }
    *(int *)(puVar10 + 2) = (int)uVar12;
    if (((ulong)puVar10[3] & 0x10) != 0) {
      uVar16 = uVar16 + 1;
      uVar17 = (ulong)uVar16;
      uVar3 = p_Var2[uVar12].numUnpackStreams;
      if (uVar3 <= uVar17) {
        uVar16 = 0;
      }
      uVar12 = (ulong)((uint)(uVar3 <= uVar17) + (int)uVar12);
    }
  }
  uVar14 = (ulong)((int)uVar14 + 1);
  if (val->numFolders <= uVar14) {
    return 0;
  }
  goto LAB_00176dd7;
}

Assistant:

static int
read_Header(struct archive_read *a, struct _7z_header_info *h,
    int check_header_id)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7z_folder *folders;
	struct _7z_stream_info *si = &(zip->si);
	struct _7zip_entry *entries;
	uint32_t folderIndex, indexInFolder;
	unsigned i;
	int eindex, empty_streams, sindex;

	if (check_header_id) {
		/*
		 * Read Header.
		 */
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		if (*p != kHeader)
			return (-1);
	}

	/*
	 * Read ArchiveProperties.
	 */
	if ((p = header_bytes(a, 1)) == NULL)
		return (-1);
	if (*p == kArchiveProperties) {
		for (;;) {
			uint64_t size;
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			if (*p == 0)
				break;
			if (parse_7zip_uint64(a, &size) < 0)
				return (-1);
		}
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}

	/*
	 * Read MainStreamsInfo.
	 */
	if (*p == kMainStreamsInfo) {
		if (read_StreamsInfo(a, &(zip->si)) < 0)
			return (-1);
		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
	}
	if (*p == kEnd)
		return (0);

	/*
	 * Read FilesInfo.
	 */
	if (*p != kFilesInfo)
		return (-1);

	if (parse_7zip_uint64(a, &(zip->numFiles)) < 0)
		return (-1);
	if (UMAX_ENTRY < zip->numFiles)
		return (-1);

	zip->entries = calloc((size_t)zip->numFiles, sizeof(*zip->entries));
	if (zip->entries == NULL)
		return (-1);
	entries = zip->entries;

	empty_streams = 0;
	for (;;) {
		int type;
		uint64_t size;
		size_t ll;

		if ((p = header_bytes(a, 1)) == NULL)
			return (-1);
		type = *p;
		if (type == kEnd)
			break;

		if (parse_7zip_uint64(a, &size) < 0)
			return (-1);
		if (zip->header_bytes_remaining < size)
			return (-1);
		ll = (size_t)size;

		switch (type) {
		case kEmptyStream:
			if (h->emptyStreamBools != NULL)
				return (-1);
			h->emptyStreamBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->emptyStreamBools));
			if (h->emptyStreamBools == NULL)
				return (-1);
			if (read_Bools(
			    a, h->emptyStreamBools, (size_t)zip->numFiles) < 0)
				return (-1);
			empty_streams = 0;
			for (i = 0; i < zip->numFiles; i++) {
				if (h->emptyStreamBools[i])
					empty_streams++;
			}
			break;
		case kEmptyFile:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->emptyFileBools != NULL)
				return (-1);
			h->emptyFileBools = calloc(empty_streams,
			    sizeof(*h->emptyFileBools));
			if (h->emptyFileBools == NULL)
				return (-1);
			if (read_Bools(a, h->emptyFileBools, empty_streams) < 0)
				return (-1);
			break;
		case kAnti:
			if (empty_streams <= 0) {
				/* Unexcepted sequence. Skip this. */
				if (header_bytes(a, ll) == NULL)
					return (-1);
				break;
			}
			if (h->antiBools != NULL)
				return (-1);
			h->antiBools = calloc(empty_streams,
			    sizeof(*h->antiBools));
			if (h->antiBools == NULL)
				return (-1);
			if (read_Bools(a, h->antiBools, empty_streams) < 0)
				return (-1);
			break;
		case kCTime:
		case kATime:
		case kMTime:
			if (read_Times(a, h, type) < 0)
				return (-1);
			break;
		case kName:
		{
			unsigned char *np;
			size_t nl, nb;

			/* Skip one byte. */
			if ((p = header_bytes(a, 1)) == NULL)
				return (-1);
			ll--;

			if ((ll & 1) || ll < zip->numFiles * 4)
				return (-1);

			if (zip->entry_names != NULL)
				return (-1);
			zip->entry_names = malloc(ll);
			if (zip->entry_names == NULL)
				return (-1);
			np = zip->entry_names;
			nb = ll;
			/*
			 * Copy whole file names.
			 * NOTE: This loop prevents from expanding
			 * the uncompressed buffer in order not to
			 * use extra memory resource.
			 */
			while (nb) {
				size_t b;
				if (nb > UBUFF_SIZE)
					b = UBUFF_SIZE;
				else
					b = nb;
				if ((p = header_bytes(a, b)) == NULL)
					return (-1);
				memcpy(np, p, b);
				np += b;
				nb -= b;
			}
			np = zip->entry_names;
			nl = ll;

			for (i = 0; i < zip->numFiles; i++) {
				entries[i].utf16name = np;
#if defined(_WIN32) && !defined(__CYGWIN__) && defined(_DEBUG)
				entries[i].wname = (wchar_t *)np;
#endif

				/* Find a terminator. */
				while (nl >= 2 && (np[0] || np[1])) {
					np += 2;
					nl -= 2;
				}
				if (nl < 2)
					return (-1);/* Terminator not found */
				entries[i].name_len = np - entries[i].utf16name;
				np += 2;
				nl -= 2;
			}
			break;
		}
		case kAttributes:
		{
			int allAreDefined;

			if ((p = header_bytes(a, 2)) == NULL)
				return (-1);
			allAreDefined = *p;
			if (h->attrBools != NULL)
				return (-1);
			h->attrBools = calloc((size_t)zip->numFiles,
			    sizeof(*h->attrBools));
			if (h->attrBools == NULL)
				return (-1);
			if (allAreDefined)
				memset(h->attrBools, 1, (size_t)zip->numFiles);
			else {
				if (read_Bools(a, h->attrBools,
				      (size_t)zip->numFiles) < 0)
					return (-1);
			}
			for (i = 0; i < zip->numFiles; i++) {
				if (h->attrBools[i]) {
					if ((p = header_bytes(a, 4)) == NULL)
						return (-1);
					entries[i].attr = archive_le32dec(p);
				}
			}
			break;
		}
		case kDummy:
			if (ll == 0)
				break;
			__LA_FALLTHROUGH;
		default:
			if (header_bytes(a, ll) == NULL)
				return (-1);
			break;
		}
	}

	/*
	 * Set up entry's attributes.
	 */
	folders = si->ci.folders;
	eindex = sindex = 0;
	folderIndex = indexInFolder = 0;
	for (i = 0; i < zip->numFiles; i++) {
		if (h->emptyStreamBools == NULL || h->emptyStreamBools[i] == 0)
			entries[i].flg |= HAS_STREAM;
		/* The high 16 bits of attributes is a posix file mode. */
		entries[i].mode = entries[i].attr >> 16;

		if (!(entries[i].attr & FILE_ATTRIBUTE_UNIX_EXTENSION)) {
			// Only windows permissions specified for this entry. Translate to
			// reasonable corresponding unix permissions.

			if (entries[i].attr & FILE_ATTRIBUTE_DIRECTORY) {
				if (entries[i].attr & FILE_ATTRIBUTE_READONLY) {
					// Read-only directory.
					entries[i].mode = AE_IFDIR | 0555;
				} else {
					// Read-write directory.
					entries[i].mode = AE_IFDIR | 0755;
				}
			} else if (entries[i].attr & FILE_ATTRIBUTE_READONLY) {
				// Readonly file.
				entries[i].mode = AE_IFREG | 0444;
			} else {
				// Assume read-write file.
				entries[i].mode = AE_IFREG | 0644;
			}
		}

		if (entries[i].flg & HAS_STREAM) {
			if ((size_t)sindex >= si->ss.unpack_streams)
				return (-1);
			if (entries[i].mode == 0)
				entries[i].mode = AE_IFREG | 0666;
			if (si->ss.digestsDefined[sindex])
				entries[i].flg |= CRC32_IS_SET;
			entries[i].ssIndex = sindex;
			sindex++;
		} else {
			int dir;
			if (h->emptyFileBools == NULL)
				dir = 1;
			else {
				if (h->emptyFileBools[eindex])
					dir = 0;
				else
					dir = 1;
				eindex++;
			}
			if (entries[i].mode == 0) {
				if (dir)
					entries[i].mode = AE_IFDIR | 0777;
				else
					entries[i].mode = AE_IFREG | 0666;
			} else if (dir &&
			    (entries[i].mode & AE_IFMT) != AE_IFDIR) {
				entries[i].mode &= ~AE_IFMT;
				entries[i].mode |= AE_IFDIR;
			}
			if ((entries[i].mode & AE_IFMT) == AE_IFDIR &&
			    entries[i].name_len >= 2 &&
			    (entries[i].utf16name[entries[i].name_len-2] != '/' ||
			     entries[i].utf16name[entries[i].name_len-1] != 0)) {
				entries[i].utf16name[entries[i].name_len] = '/';
				entries[i].utf16name[entries[i].name_len+1] = 0;
				entries[i].name_len += 2;
			}
			entries[i].ssIndex = -1;
		}
		if (entries[i].attr & FILE_ATTRIBUTE_READONLY)
			entries[i].mode &= ~0222;/* Read only. */

		if ((entries[i].flg & HAS_STREAM) == 0 && indexInFolder == 0) {
			/*
			 * The entry is an empty file or a directory file,
			 * those both have no contents.
			 */
			entries[i].folderIndex = -1;
			continue;
		}
		if (indexInFolder == 0) {
			for (;;) {
				if (folderIndex >= si->ci.numFolders)
					return (-1);
				if (folders[folderIndex].numUnpackStreams)
					break;
				folderIndex++;
			}
		}
		entries[i].folderIndex = folderIndex;
		if ((entries[i].flg & HAS_STREAM) == 0)
			continue;
		indexInFolder++;
		if (indexInFolder >= folders[folderIndex].numUnpackStreams) {
			folderIndex++;
			indexInFolder = 0;
		}
	}

	return (0);
}